

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::Handler<capnproto_test::capnp::test::TestInterface,_(capnp::Style)3>::decodeBase
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,
          Handler<capnproto_test::capnp::test::TestInterface,_(capnp::Style)3> *this,
          JsonCodec *codec,Reader input,Type type,Orphanage orphanage)

{
  long *plVar1;
  undefined8 in_R9;
  undefined1 local_48 [16];
  long *local_38;
  OrphanBuilder local_30;
  
  (*(this->super_HandlerBase)._vptr_HandlerBase[4])
            ((Client *)local_48,this,codec,type._0_8_,type.field_4.schema,in_R9,
             input._reader.segment._0_4_,input._reader.capTable._0_4_,input._reader.data._0_4_,
             input._reader.pointers._0_4_,input._reader.dataSize,input._reader.nestingLimit);
  Orphanage::newOrphanCopy<capnproto_test::capnp::test::TestInterface::Client>
            ((Orphan<capnproto_test::capnp::test::TestInterface> *)&local_30,&orphanage,
             (Client *)local_48);
  Orphan<capnp::DynamicValue>::Orphan<capnproto_test::capnp::test::TestInterface>
            (__return_storage_ptr__,(Orphan<capnproto_test::capnp::test::TestInterface> *)&local_30)
  ;
  if (local_30.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&local_30);
  }
  plVar1 = local_38;
  if (local_38 != (long *)0x0) {
    local_38 = (long *)0x0;
    (*(code *)**(undefined8 **)local_48._8_8_)
              (local_48._8_8_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> decodeBase(const JsonCodec& codec, JsonValue::Reader input,
                                  Type type, Orphanage orphanage) const override final {
    return orphanage.newOrphanCopy(decode(codec, input));
  }